

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  StyledWriter *in_RDI;
  
  ~StyledWriter(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~StyledWriter() {}